

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

ZSTD_parameters *
duckdb_zstd::ZSTD_getParams_internal
          (ZSTD_parameters *__return_storage_ptr__,int compressionLevel,
          unsigned_long_long srcSizeHint,size_t dictSize,ZSTD_cParamMode_e mode)

{
  ZSTD_getCParams_internal
            (&__return_storage_ptr__->cParams,compressionLevel,srcSizeHint,dictSize,mode);
  (__return_storage_ptr__->fParams).checksumFlag = 0;
  (__return_storage_ptr__->fParams).noDictIDFlag = 0;
  (__return_storage_ptr__->fParams).contentSizeFlag = 1;
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_parameters ZSTD_getParams_internal(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode) {
    ZSTD_parameters params;
    ZSTD_compressionParameters const cParams = ZSTD_getCParams_internal(compressionLevel, srcSizeHint, dictSize, mode);
    DEBUGLOG(5, "ZSTD_getParams (cLevel=%i)", compressionLevel);
    ZSTD_memset(&params, 0, sizeof(params));
    params.cParams = cParams;
    params.fParams.contentSizeFlag = 1;
    return params;
}